

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.hpp
# Opt level: O2

optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> __thiscall
duckdb::Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
          (Catalog *this,ClientContext *context,string *schema_name,string *name,
          OnEntryNotFound if_not_found,QueryErrorContext error_context)

{
  CatalogEntry *pCVar1;
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> oVar2;
  CatalogException *this_00;
  allocator local_a1;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  EntryLookupInfo lookup_info;
  
  EntryLookupInfo::EntryLookupInfo(&lookup_info,COPY_FUNCTION_ENTRY,name,error_context);
  entry = GetEntry(this,context,schema_name,&lookup_info,if_not_found);
  if (entry.ptr == (CatalogEntry *)0x0) {
    oVar2.ptr = (CopyFunctionCatalogEntry *)0x0;
  }
  else {
    pCVar1 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    if (pCVar1->type != COPY_FUNCTION_ENTRY) {
      this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_70,"%s is not an %s",&local_a1);
      ::std::__cxx11::string::string((string *)&local_90,(string *)name);
      CatalogException::CatalogException<std::__cxx11::string,char_const*>
                (this_00,error_context,&local_70,&local_90,"copy function");
      __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    oVar2.ptr = (CopyFunctionCatalogEntry *)
                optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
  }
  return (optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<T> GetEntry(ClientContext &context, const string &schema_name, const string &name,
	                         OnEntryNotFound if_not_found, QueryErrorContext error_context = QueryErrorContext()) {
		EntryLookupInfo lookup_info(T::Type, name, error_context);
		auto entry = GetEntry(context, schema_name, lookup_info, if_not_found);
		if (!entry) {
			return nullptr;
		}
		if (entry->type != T::Type) {
			throw CatalogException(error_context, "%s is not an %s", name, T::Name);
		}
		return &entry->template Cast<T>();
	}